

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O0

size_t Assimp::FBX::ParseTokenAsDim(Token *t,char **err_out)

{
  size_t sVar1;
  bool bVar2;
  TokenType TVar3;
  char *pcVar4;
  char *pcVar5;
  Token *pTVar6;
  size_t id;
  char *out;
  uint length;
  uint64_t id_1;
  char *data;
  char **err_out_local;
  Token *t_local;
  
  *err_out = (char *)0x0;
  data = (char *)err_out;
  err_out_local = &t->sbegin;
  TVar3 = Token::Type(t);
  if (TVar3 == TokenType_DATA) {
    bVar2 = Token::IsBinary((Token *)err_out_local);
    if (bVar2) {
      id_1 = (uint64_t)Token::begin((Token *)err_out_local);
      if (*(char *)id_1 == 'L') {
        pcVar4 = (char *)(id_1 + 1);
        pcVar5 = Token::end((Token *)err_out_local);
        t_local = (Token *)anon_unknown.dwarf_1924db::SafeParse<unsigned_long>(pcVar4,pcVar5);
      }
      else {
        *(char **)data = "failed to parse ID, unexpected data type, expected L(ong) (binary)";
        t_local = (Token *)0x0;
      }
    }
    else {
      pcVar4 = Token::begin((Token *)err_out_local);
      if (*pcVar4 == '*') {
        pcVar4 = Token::end((Token *)err_out_local);
        pcVar5 = Token::begin((Token *)err_out_local);
        out._4_4_ = (int)pcVar4 - (int)pcVar5;
        if (out._4_4_ == 0) {
          *(char **)data = "expected valid integer number after asterisk";
          t_local = (Token *)0x0;
        }
        else {
          id = 0;
          pcVar4 = Token::begin((Token *)err_out_local);
          pTVar6 = (Token *)strtoul10_64(pcVar4 + 1,(char **)&id,(uint *)((long)&out + 4));
          sVar1 = id;
          pcVar4 = Token::end((Token *)err_out_local);
          t_local = pTVar6;
          if (pcVar4 < sVar1) {
            *(char **)data = "failed to parse ID";
            t_local = (Token *)0x0;
          }
        }
      }
      else {
        *(char **)data = "expected asterisk before array dimension";
        t_local = (Token *)0x0;
      }
    }
  }
  else {
    *(char **)data = "expected TOK_DATA token";
    t_local = (Token *)0x0;
  }
  return (size_t)t_local;
}

Assistant:

size_t ParseTokenAsDim(const Token& t, const char*& err_out)
{
    // same as ID parsing, except there is a trailing asterisk
    err_out = NULL;

    if (t.Type() != TokenType_DATA) {
        err_out = "expected TOK_DATA token";
        return 0;
    }

    if(t.IsBinary())
    {
        const char* data = t.begin();
        if (data[0] != 'L') {
            err_out = "failed to parse ID, unexpected data type, expected L(ong) (binary)";
            return 0;
        }

        BE_NCONST uint64_t id = SafeParse<uint64_t>(data+1, t.end());
        AI_SWAP8(id);
        return static_cast<size_t>(id);
    }

    if(*t.begin() != '*') {
        err_out = "expected asterisk before array dimension";
        return 0;
    }

    // XXX: should use size_t here
    unsigned int length = static_cast<unsigned int>(t.end() - t.begin());
    if(length == 0) {
        err_out = "expected valid integer number after asterisk";
        return 0;
    }

    const char* out = nullptr;
    const size_t id = static_cast<size_t>(strtoul10_64(t.begin() + 1,&out,&length));
    if (out > t.end()) {
        err_out = "failed to parse ID";
        return 0;
    }

    return id;
}